

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O2

void __thiscall FM::OPNA::RhythmMix(OPNA *this,Sample *buffer,uint count)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int i;
  long lVar8;
  uint uVar9;
  short *psVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  
  iVar4 = this->rhythmtvol;
  if (((iVar4 < 0x80) && (this->rhythm[0].sample != (int16 *)0x0)) &&
     (bVar1 = this->rhythmkey, (bVar1 & 0x3f) != 0)) {
    cVar2 = this->rhythmtl;
    uVar5 = (this->super_OPNABase).rhythmmask_;
    for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
      if ((bVar1 >> ((uint)lVar8 & 0x1f) & 1) != 0) {
        iVar11 = (int)this->rhythm[lVar8].level + iVar4 + cVar2 + this->rhythm[lVar8].volume;
        if (iVar11 < -0x1e) {
          iVar11 = -0x1f;
        }
        if (0x7e < iVar11) {
          iVar11 = 0x7f;
        }
        iVar11 = (&OPNABase::tltable)[iVar11 + 0x20];
        bVar3 = this->rhythm[lVar8].pan;
        uVar9 = (int)((uint)bVar3 << 0x1e) >> 0x1f;
        psVar10 = buffer;
        uVar7 = -(bVar3 & 1);
        if ((uVar5 & 1 << ((byte)lVar8 & 0x1f)) != 0) {
          uVar9 = 0;
          uVar7 = 0;
        }
        while ((psVar10 < buffer + count * 2 &&
               (uVar6 = this->rhythm[lVar8].pos, uVar6 < this->rhythm[lVar8].size))) {
          uVar13 = (int)this->rhythm[lVar8].sample[uVar6 >> 10] * (iVar11 >> 4) >> 0xc;
          this->rhythm[lVar8].pos = uVar6 + this->rhythm[lVar8].step;
          iVar12 = (int)*psVar10 + (uVar13 & uVar9);
          if (iVar12 < -0x7fff) {
            iVar12 = -0x8000;
          }
          if (0x7ffe < iVar12) {
            iVar12 = 0x7fff;
          }
          *psVar10 = (short)iVar12;
          iVar12 = (int)psVar10[1] + (uVar13 & uVar7);
          if (iVar12 < -0x7fff) {
            iVar12 = -0x8000;
          }
          if (0x7ffe < iVar12) {
            iVar12 = 0x7fff;
          }
          psVar10[1] = (short)iVar12;
          psVar10 = psVar10 + 2;
        }
      }
    }
  }
  return;
}

Assistant:

void OPNA::RhythmMix(Sample* buffer, uint count)
{
	if (rhythmtvol < 128 && rhythm[0].sample && (rhythmkey & 0x3f))
	{
		Sample* limit = buffer + count * 2;
		for (int i=0; i<6; i++)
		{
			Rhythm& r = rhythm[i];
			if ((rhythmkey & (1 << i)) /*&& r.level < 128*/) // libOPNMIDI: Useless condition, signed int 8t has 127 max
			{
				int db = Limit(rhythmtl+rhythmtvol+r.level+r.volume, 127, -31);
				int vol = tltable[FM_TLPOS+(db << (FM_TLBITS-7))] >> 4;
				int maskl = -((r.pan >> 1) & 1);
				int maskr = -(r.pan & 1);

				if (rhythmmask_ & (1 << i))
				{
					maskl = maskr = 0;
				}

				for (Sample* dest = buffer; dest<limit && r.pos < r.size; dest+=2)
				{
					int sample = (r.sample[r.pos / 1024] * vol) >> 12;
					r.pos += r.step;
					StoreSample(dest[0], sample & maskl);
					StoreSample(dest[1], sample & maskr);
				}
			}
		}
	}
}